

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O1

CK_RV __thiscall
SoftHSM::C_Encrypt(SoftHSM *this,CK_SESSION_HANDLE hSession,CK_BYTE_PTR pData,CK_ULONG ulDataLen,
                  CK_BYTE_PTR pEncryptedData,CK_ULONG_PTR pulEncryptedDataLen)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  Type TVar4;
  Session *this_00;
  SymmetricAlgorithm *pSVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  AsymmetricAlgorithm *pAVar6;
  PublicKey *pPVar7;
  uchar *puVar8;
  size_t sVar9;
  undefined4 extraout_var_02;
  ulong uVar10;
  CK_RV CVar11;
  ByteString encryptedData;
  ByteString data;
  ulong local_c0;
  ByteString local_a8;
  ByteString local_80;
  ByteString local_58;
  
  if (this->isInitialised != true) {
    return 400;
  }
  this_00 = (Session *)HandleManager::getSession(this->handleManager,hSession);
  if (this_00 == (Session *)0x0) {
    return 0xb3;
  }
  if (pData == (CK_BYTE_PTR)0x0 || pulEncryptedDataLen == (CK_ULONG_PTR)0x0) {
    Session::resetOp(this_00);
    return 7;
  }
  iVar2 = Session::getOpType(this_00);
  if (iVar2 != 2) {
    return 0x91;
  }
  pSVar5 = Session::getSymmetricCryptoOp(this_00);
  if (pSVar5 != (SymmetricAlgorithm *)0x0) {
    pSVar5 = Session::getSymmetricCryptoOp(this_00);
    if ((pSVar5 == (SymmetricAlgorithm *)0x0) ||
       (bVar1 = Session::getAllowSinglePartOp(this_00), !bVar1)) goto LAB_00130e63;
    iVar2 = (*pSVar5->_vptr_SymmetricAlgorithm[0x11])(pSVar5);
    local_c0 = CONCAT44(extraout_var,iVar2) + ulDataLen;
    iVar2 = (*pSVar5->_vptr_SymmetricAlgorithm[0x13])(pSVar5);
    if ((char)iVar2 != '\0') {
      iVar2 = (*pSVar5->_vptr_SymmetricAlgorithm[0xd])(pSVar5);
      uVar10 = ulDataLen % CONCAT44(extraout_var_00,iVar2);
      iVar2 = (*pSVar5->_vptr_SymmetricAlgorithm[0xf])(pSVar5);
      if (uVar10 != 0 && (char)iVar2 == '\0') {
        Session::resetOp(this_00);
      }
      else if (uVar10 == 0) {
        iVar3 = (*pSVar5->_vptr_SymmetricAlgorithm[0xf])(pSVar5);
        if ((char)iVar3 != '\0') {
          iVar3 = (*pSVar5->_vptr_SymmetricAlgorithm[0xd])();
          local_c0 = CONCAT44(extraout_var_02,iVar3) + ulDataLen;
        }
      }
      else {
        iVar3 = (*pSVar5->_vptr_SymmetricAlgorithm[0xd])();
        local_c0 = (ulDataLen - uVar10) + CONCAT44(extraout_var_01,iVar3);
      }
      if (uVar10 != 0 && (char)iVar2 == '\0') {
        return 0x21;
      }
    }
    iVar2 = (*pSVar5->_vptr_SymmetricAlgorithm[0x14])(pSVar5,ulDataLen);
    if ((char)iVar2 == '\0') {
      Session::resetOp(this_00);
      return 0x21;
    }
    if (pEncryptedData == (CK_BYTE_PTR)0x0) {
      *pulEncryptedDataLen = local_c0;
      return 0;
    }
    if (*pulEncryptedDataLen < local_c0) {
      *pulEncryptedDataLen = local_c0;
      return 0x150;
    }
    ByteString::ByteString(&local_80,pData,ulDataLen);
    ByteString::ByteString(&local_a8);
    iVar2 = (*pSVar5->_vptr_SymmetricAlgorithm[3])(pSVar5,&local_80,&local_a8);
    if ((char)iVar2 == '\0') {
      CVar11 = 5;
      Session::resetOp(this_00);
    }
    else {
      ByteString::ByteString(&local_58);
      iVar2 = (*pSVar5->_vptr_SymmetricAlgorithm[4])(pSVar5,&local_58);
      if ((char)iVar2 == '\0') {
        CVar11 = 5;
        Session::resetOp(this_00);
      }
      else {
        ByteString::operator+=(&local_a8,&local_58);
        ByteString::resize(&local_a8,local_c0);
        puVar8 = ByteString::byte_str(&local_a8);
        sVar9 = ByteString::size(&local_a8);
        memcpy(pEncryptedData,puVar8,sVar9);
        sVar9 = ByteString::size(&local_a8);
        *pulEncryptedDataLen = sVar9;
        Session::resetOp(this_00);
        CVar11 = 0;
      }
      local_58._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
      std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
                (&local_58.byteString.
                  super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
    }
    local_a8._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
    std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
              (&local_a8.byteString.
                super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
    goto LAB_00131141;
  }
  pAVar6 = Session::getAsymmetricCryptoOp(this_00);
  TVar4 = Session::getMechanism(this_00);
  pPVar7 = Session::getPublicKey(this_00);
  if ((pAVar6 == (AsymmetricAlgorithm *)0x0) ||
     (bVar1 = Session::getAllowSinglePartOp(this_00), pPVar7 == (PublicKey *)0x0 || !bVar1)) {
LAB_00130e63:
    Session::resetOp(this_00);
    return 0x91;
  }
  uVar10 = (**(code **)(*(long *)pPVar7 + 0x28))(pPVar7);
  if (pEncryptedData == (CK_BYTE_PTR)0x0) {
    *pulEncryptedDataLen = uVar10;
    return 0;
  }
  if (*pulEncryptedDataLen < uVar10) {
    *pulEncryptedDataLen = uVar10;
    return 0x150;
  }
  ByteString::ByteString(&local_80);
  ByteString::ByteString(&local_a8);
  if (TVar4 == RSA) {
    ByteString::wipe(&local_80,uVar10 - ulDataLen);
  }
  ByteString::ByteString(&local_58,pData,ulDataLen);
  ByteString::operator+=(&local_80,&local_58);
  local_58._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&local_58.byteString.super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>
            );
  iVar2 = (*pAVar6->_vptr_AsymmetricAlgorithm[10])(pAVar6,pPVar7,&local_80,&local_a8,TVar4);
  if ((char)iVar2 == '\0') {
LAB_001310d3:
    CVar11 = 5;
    Session::resetOp(this_00);
  }
  else {
    sVar9 = ByteString::size(&local_a8);
    if (sVar9 != uVar10) {
      softHSMLog(3,"AsymEncrypt",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                 ,0xa53,"The size of the encrypted data differs from the size of the mechanism");
      goto LAB_001310d3;
    }
    puVar8 = ByteString::byte_str(&local_a8);
    memcpy(pEncryptedData,puVar8,uVar10);
    *pulEncryptedDataLen = uVar10;
    Session::resetOp(this_00);
    CVar11 = 0;
  }
  local_a8._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&local_a8.byteString.super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>
            );
LAB_00131141:
  local_80._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&local_80.byteString.super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>
            );
  return CVar11;
}

Assistant:

CK_RV SoftHSM::C_Encrypt(CK_SESSION_HANDLE hSession, CK_BYTE_PTR pData, CK_ULONG ulDataLen, CK_BYTE_PTR pEncryptedData, CK_ULONG_PTR pulEncryptedDataLen)
{
	if (!isInitialised) return CKR_CRYPTOKI_NOT_INITIALIZED;

	// Get the session
	Session* session = (Session*)handleManager->getSession(hSession);
	if (session == NULL) return CKR_SESSION_HANDLE_INVALID;

	if ((pData == NULL_PTR) || (pulEncryptedDataLen == NULL_PTR))
	{
		// Fix issue 585
		session->resetOp();

		return CKR_ARGUMENTS_BAD;
	}

	// Check if we are doing the correct operation
	if (session->getOpType() != SESSION_OP_ENCRYPT)
		return CKR_OPERATION_NOT_INITIALIZED;

	if (session->getSymmetricCryptoOp() != NULL)
		return SymEncrypt(session, pData, ulDataLen,
				  pEncryptedData, pulEncryptedDataLen);
	else
		return AsymEncrypt(session, pData, ulDataLen,
				   pEncryptedData, pulEncryptedDataLen);
}